

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::PrependAndMatch(ON_PolyCurve *this,ON_Curve *c)

{
  ON_Curve *pOVar1;
  int iVar2;
  uint uVar3;
  ON_3dPoint local_50;
  ON_3dPoint local_38;
  ON_Curve *local_20;
  ON_Curve *c_local;
  ON_PolyCurve *this_local;
  
  local_20 = c;
  c_local = &this->super_ON_Curve;
  iVar2 = Count(this);
  pOVar1 = local_20;
  if (iVar2 == 0) {
    this_local._7_1_ = Prepend(this,local_20);
  }
  else {
    ON_Curve::PointAtStart(&local_38,&this->super_ON_Curve);
    uVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
    if ((uVar3 & 1) == 0) {
      ON_Curve::PointAtEnd(&local_50,local_20);
      uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])();
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    this_local._7_1_ = Prepend(this,local_20);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyCurve::PrependAndMatch(ON_Curve* c)

{
  if (Count() == 0) return Prepend(c);
  //if (IsClosed() || c->IsClosed()) return false;
  if (!c->SetEndPoint(PointAtStart())){
    if (!SetStartPoint(c->PointAtEnd()))
      return false;
  }
  return Prepend(c);
}